

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host-gl.c
# Opt level: O0

Result host_gl_program(GLuint vert_shader,GLuint frag_shader,GLuint *out_program)

{
  GLchar *pGVar1;
  GLchar *log;
  int local_28;
  GLint length;
  GLint status;
  GLuint program;
  GLuint *out_program_local;
  GLuint local_10;
  GLuint frag_shader_local;
  GLuint vert_shader_local;
  
  _status = out_program;
  out_program_local._4_4_ = frag_shader;
  local_10 = vert_shader;
  length = (*glCreateProgram)();
  (*glAttachShader)(length,local_10);
  (*glAttachShader)(length,out_program_local._4_4_);
  (*glLinkProgram)(length);
  (*glGetProgramiv)(length,0x8b82,&local_28);
  if (local_28 != 0) {
    *_status = length;
  }
  else {
    (*glGetProgramiv)(length,0x8b84,(GLint *)((long)&log + 4));
    pGVar1 = (GLchar *)malloc((long)(log._4_4_ + 1));
    (*glGetProgramInfoLog)(length,log._4_4_,(GLsizei *)0x0,pGVar1);
    fprintf(_stderr,"%s ERROR: %s\n","GL_PROGRAM",pGVar1);
  }
  frag_shader_local = (GLuint)(local_28 == 0);
  return frag_shader_local;
}

Assistant:

Result host_gl_program(GLuint vert_shader, GLuint frag_shader,
                       GLuint* out_program) {
  GLuint program = glCreateProgram();
  glAttachShader(program, vert_shader);
  glAttachShader(program, frag_shader);
  glLinkProgram(program);
  CHECK_LOG(program, Program, GL_LINK_STATUS, "GL_PROGRAM");
  *out_program = program;
  return OK;
  ON_ERROR_RETURN;
}